

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O2

void __thiscall ChatWindow::attemptConnection(ChatWindow *this)

{
  ChatClient *this_00;
  QArrayDataPointer<char16_t> local_88;
  QString hostAddress;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  tr((QString *)&local_88,"Chose Server",(char *)0x0,-1);
  tr((QString *)&local_40,"Server Address",(char *)0x0,-1);
  local_28.d = (Data *)0x0;
  local_28.ptr = L"127.0.0.1";
  local_28.size = 9;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QInputDialog::getText(&hostAddress,this,&local_88,&local_40,0,&local_28,0,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (hostAddress.d.size != 0) {
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 8),0));
    this_00 = this->m_chatClient;
    QHostAddress::QHostAddress((QHostAddress *)&local_88,&hostAddress);
    ChatClient::connectToServer(this_00,(QHostAddress *)&local_88,0x7af);
    QHostAddress::~QHostAddress((QHostAddress *)&local_88);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&hostAddress.d);
  return;
}

Assistant:

void ChatWindow::attemptConnection()
{
    // We ask the user for the address of the server, we use 127.0.0.1 (aka localhost) as default
    const QString hostAddress = QInputDialog::getText(
        this
        , tr("Chose Server")
        , tr("Server Address")
        , QLineEdit::Normal
        , QStringLiteral("127.0.0.1")
    );
    if (hostAddress.isEmpty())
        return; // the user pressed cancel or typed nothing
    // disable the connect button to prevent the user clicking it again
    ui->connectButton->setEnabled(false);
    // tell the client to connect to the host using the port 1967
    m_chatClient->connectToServer(QHostAddress(hostAddress), 1967);
}